

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noHash.c
# Opt level: O0

uint64_t * noHashBlockFromFile(uint8_t *fname,SkeinSize_t state_size)

{
  _Bool _Var1;
  int __fd;
  uint64_t uVar2;
  int_fast32_t iVar3;
  int fd;
  uint64_t block_byte_size;
  uint64_t *block;
  SkeinSize_t state_size_local;
  uint8_t *fname_local;
  
  block_byte_size = 0;
  _Var1 = exists(fname);
  if ((_Var1) && (uVar2 = getFileSize(fname), state_size >> 3 <= uVar2)) {
    printf(
          "***Warning*** You have turned off password hashing and specified a password file. If the file you have specified is shorter then the key size it will be rejected. If it is greater then the keysize then all bits greater then the key size will be truncated. This poses a security risk (do not do this unless you know exactly what you are doing)\n"
          );
    iVar3 = openForRead(fname);
    __fd = (int)iVar3;
    if (0 < __fd) {
      block_byte_size = (uint64_t)readBytes((ulong)(state_size >> 3),(long)__fd);
      close(__fd);
    }
  }
  return (uint64_t *)block_byte_size;
}

Assistant:

uint64_t* noHashBlockFromFile(const uint8_t* fname, const SkeinSize_t state_size)
{
    uint64_t* block = NULL;
    const uint64_t block_byte_size = state_size/8;

    if(exists(fname) && getFileSize(fname) >= block_byte_size)
    {
        printf("***Warning*** You have turned off password hashing and specified a password file. If the file you have specified is shorter then the key size it will be rejected. If it is greater then the keysize then all bits greater then the key size will be truncated. This poses a security risk (do not do this unless you know exactly what you are doing)\n");

	    int fd = openForRead(fname);
	    if(fd > 0)
	    {
	        block = (uint64_t*)readBytes(block_byte_size, fd);
	        close(fd); 
	    }
    }

    return block;
}